

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode http_size(Curl_easy *data)

{
  SingleRequest *pSVar1;
  SingleRequest *k;
  Curl_easy *data_local;
  
  pSVar1 = &data->req;
  if (((*(uint *)&(data->req).field_0xd1 >> 0xe & 1) == 0) &&
     ((*(uint *)&(data->req).field_0xd1 >> 0xc & 1) == 0)) {
    if (pSVar1->size != -1) {
      if ((((data->set).max_filesize != 0) && ((*(uint *)&(data->req).field_0xd1 >> 10 & 1) == 0))
         && ((data->set).max_filesize < pSVar1->size)) {
        Curl_failf(data,"Maximum file size exceeded");
        return CURLE_FILESIZE_EXCEEDED;
      }
      if ((((*(uint *)&(data->req).field_0xd1 >> 10 & 1) != 0) && (data != (Curl_easy *)0x0)) &&
         (((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0 &&
          (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))))))
      {
        Curl_infof(data,"setting size while ignoring");
      }
      Curl_pgrsSetDownloadSize(data,pSVar1->size);
      (data->req).maxdownload = pSVar1->size;
    }
  }
  else {
    (data->req).maxdownload = -1;
    pSVar1->size = -1;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode http_size(struct Curl_easy *data)
{
  struct SingleRequest *k = &data->req;
  if(data->req.ignore_cl || k->chunk) {
    k->size = k->maxdownload = -1;
  }
  else if(k->size != -1) {
    if(data->set.max_filesize &&
       !k->ignorebody &&
       (k->size > data->set.max_filesize)) {
      failf(data, "Maximum file size exceeded");
      return CURLE_FILESIZE_EXCEEDED;
    }
    if(k->ignorebody)
      infof(data, "setting size while ignoring");
    Curl_pgrsSetDownloadSize(data, k->size);
    k->maxdownload = k->size;
  }
  return CURLE_OK;
}